

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

Ratio * Ratio::combine(Ratio *r1,Ratio *r2)

{
  bool bVar1;
  Ratio *in_RDI;
  Ratio *pRVar2;
  Ratio *r;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffa8;
  Ratio *in_stack_ffffffffffffffb0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  
  uVar3 = 0;
  pRVar2 = in_RDI;
  Ratio(in_stack_ffffffffffffffb0);
  bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)pRVar2);
  if ((bVar1) &&
     (bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)pRVar2), bVar1)) {
    geoAvg((double)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    setELength(in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
  }
  else {
    setAllEEdges(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    addAllEEdges((Ratio *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)pRVar2);
  if ((bVar1) &&
     (bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)pRVar2), bVar1)) {
    pRVar2 = (Ratio *)geoAvg((double)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    setFLength(pRVar2,(double)in_stack_ffffffffffffffa8);
  }
  else {
    setAllFEdges(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    addAllFEdges((Ratio *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

Ratio Ratio::combine(Ratio& r1, Ratio& r2) {
    Ratio r{};
    if ((r1.eEdges.empty()) && (r2.eEdges.empty())) {
        r.setELength(geoAvg(r1.eLength, r2.eLength));
    }
    else {
        r.setAllEEdges(r1.eEdges);
        r.addAllEEdges(r2.eEdges);
    }

    if ((r1.fEdges.empty()) && (r2.fEdges.empty())) {
        r.setFLength(geoAvg(r1.fLength, r2.fLength));
    }
    else {
        r.setAllFEdges(r1.fEdges);
        r.addAllFEdges(r2.fEdges);
    }
    return r;
}